

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WrittenFontTrueType.cpp
# Opt level: O2

bool __thiscall
WrittenFontTrueType::AddToANSIRepresentation
          (WrittenFontTrueType *this,GlyphUnicodeMappingListList *inGlyphsList,
          UShortListList *outEncodedCharacters)

{
  unsigned_short inEncodedCharacter;
  WrittenFontRepresentation *pWVar1;
  bool bVar2;
  iterator iVar3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  _List_node_base *this_00;
  UShortListList candidatesList;
  UShortList candidates;
  pair<const_unsigned_int,_GlyphEncodingInfo> local_c0;
  _List_base<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  local_98;
  GlyphEncodingInfo local_80;
  _List_base<unsigned_short,_std::allocator<unsigned_short>_> local_60;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  this_00 = (_List_node_base *)&local_98;
  local_98._M_impl._M_node.super__List_node_base._M_prev = this_00;
  local_98._M_impl._M_node.super__List_node_base._M_next = this_00;
  local_98._M_impl._M_node._M_size = 0;
  local_60._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_60;
  local_60._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_60;
  local_60._M_impl._M_node._M_size = 0;
  bVar2 = true;
  p_Var4 = (_List_node_base *)inGlyphsList;
  while ((bVar2 != false &&
         (p_Var4 = (((_List_base<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>,_std::allocator<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>_>
                      *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
         p_Var4 != (_List_node_base *)inGlyphsList))) {
    bVar2 = AddANSICandidates(this,(GlyphUnicodeMappingList *)(p_Var4 + 1),(UShortList *)&local_60);
    if (bVar2) {
      std::__cxx11::
      list<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>_>
      ::push_back((list<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                   *)this_00,(value_type *)&local_60);
      std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::clear
                ((list<unsigned_short,_std::allocator<unsigned_short>_> *)&local_60);
    }
  }
  if (bVar2 != false) {
    pWVar1 = (this->super_AbstractWrittenFont).mANSIRepresentation;
    if ((pWVar1->mGlyphIDToEncodedChar)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
      GlyphEncodingInfo::GlyphEncodingInfo(&local_80,0,0);
      local_c0.first = 0;
      local_c0.second.mEncodedCharacter = local_80.mEncodedCharacter;
      local_c0.second.mUnicodeCharacters.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_80.mUnicodeCharacters.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_c0.second.mUnicodeCharacters.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_80.mUnicodeCharacters.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_c0.second.mUnicodeCharacters.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_80.mUnicodeCharacters.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_80.mUnicodeCharacters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_80.mUnicodeCharacters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_80.mUnicodeCharacters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      _Rb_tree<unsigned_int,std::pair<unsigned_int_const,GlyphEncodingInfo>,std::_Select1st<std::pair<unsigned_int_const,GlyphEncodingInfo>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,GlyphEncodingInfo>>>
      ::_M_insert_unique<std::pair<unsigned_int_const,GlyphEncodingInfo>>
                ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,GlyphEncodingInfo>,std::_Select1st<std::pair<unsigned_int_const,GlyphEncodingInfo>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,GlyphEncodingInfo>>>
                  *)pWVar1,&local_c0);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&local_c0.second.mUnicodeCharacters.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&local_80.mUnicodeCharacters.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    }
    p_Var4 = (_List_node_base *)inGlyphsList;
    while (p_Var4 = (((_List_base<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>,_std::allocator<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>_>
                       *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var4 != (_List_node_base *)inGlyphsList) {
      this_00 = (((_List_base<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                   *)&this_00->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      p_Var5 = this_00 + 1;
      p_Var6 = p_Var4 + 1;
      while( true ) {
        p_Var6 = p_Var6->_M_next;
        p_Var5 = p_Var5->_M_next;
        if (p_Var6 == p_Var4 + 1) break;
        local_c0.first = (uint)*(ushort *)((long)(p_Var6 + 2) + 8);
        iVar3 = std::
                _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_GlyphEncodingInfo>,_std::_Select1st<std::pair<const_unsigned_int,_GlyphEncodingInfo>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_GlyphEncodingInfo>_>_>
                ::find((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_GlyphEncodingInfo>,_std::_Select1st<std::pair<const_unsigned_int,_GlyphEncodingInfo>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_GlyphEncodingInfo>_>_>
                        *)(this->super_AbstractWrittenFont).mANSIRepresentation,&local_c0.first);
        pWVar1 = (this->super_AbstractWrittenFont).mANSIRepresentation;
        if ((_Rb_tree_header *)iVar3._M_node ==
            &(pWVar1->mGlyphIDToEncodedChar)._M_t._M_impl.super__Rb_tree_header) {
          inEncodedCharacter = *(unsigned_short *)&p_Var5[1]._M_next;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48,
                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(p_Var6 + 1));
          GlyphEncodingInfo::GlyphEncodingInfo
                    (&local_80,inEncodedCharacter,(ULongVector *)&local_48);
          std::pair<const_unsigned_int,_GlyphEncodingInfo>::
          pair<const_unsigned_short_&,_GlyphEncodingInfo,_true>
                    (&local_c0,(unsigned_short *)((long)(p_Var6 + 2) + 8),&local_80);
          std::
          _Rb_tree<unsigned_int,std::pair<unsigned_int_const,GlyphEncodingInfo>,std::_Select1st<std::pair<unsigned_int_const,GlyphEncodingInfo>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,GlyphEncodingInfo>>>
          ::_M_insert_unique<std::pair<unsigned_int_const,GlyphEncodingInfo>>
                    ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,GlyphEncodingInfo>,std::_Select1st<std::pair<unsigned_int_const,GlyphEncodingInfo>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,GlyphEncodingInfo>>>
                      *)pWVar1,&local_c0);
          std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                    (&local_c0.second.mUnicodeCharacters.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
          std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                    (&local_80.mUnicodeCharacters.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
          std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_48)
          ;
        }
      }
    }
    std::__cxx11::
    list<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>_>
    ::operator=(outEncodedCharacters,
                (list<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                 *)&local_98);
  }
  std::__cxx11::_List_base<unsigned_short,_std::allocator<unsigned_short>_>::_M_clear(&local_60);
  std::__cxx11::
  _List_base<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::_M_clear(&local_98);
  return bVar2;
}

Assistant:

bool WrittenFontTrueType::AddToANSIRepresentation(	const GlyphUnicodeMappingListList& inGlyphsList,
													UShortListList& outEncodedCharacters)
{
	UShortListList candidatesList;
	UShortList candidates;
	BoolAndByte encodingResult(true,0);
	GlyphUnicodeMappingListList::const_iterator itList = inGlyphsList.begin(); 
	bool result = true;

	for(; itList != inGlyphsList.end() && result; ++itList)
	{
		result = AddANSICandidates(*itList, candidates);
		if(result)
		{
			candidatesList.push_back(candidates);
			candidates.clear();
		}
	}

	if(result)
	{
		// for the first time, add also 0,0 mapping
		if(mANSIRepresentation->mGlyphIDToEncodedChar.size() == 0)
			mANSIRepresentation->mGlyphIDToEncodedChar.insert(UIntToGlyphEncodingInfoMap::value_type(0,GlyphEncodingInfo(0,0)));


		GlyphUnicodeMappingListList::const_iterator itGlyphsList = inGlyphsList.begin();
		UShortListList::iterator itEncodedList = candidatesList.begin();
		GlyphUnicodeMappingList::const_iterator itGlyphs;
		UShortList::iterator itEncoded;

		for(; itGlyphsList != inGlyphsList.end(); ++ itGlyphsList,++itEncodedList)
		{
			itGlyphs = itGlyphsList->begin();
			itEncoded = itEncodedList->begin();
			for(; itGlyphs != itGlyphsList->end(); ++ itGlyphs,++itEncoded)
			{
				if(mANSIRepresentation->mGlyphIDToEncodedChar.find(itGlyphs->mGlyphCode) == mANSIRepresentation->mGlyphIDToEncodedChar.end())
					mANSIRepresentation->mGlyphIDToEncodedChar.insert(
					UIntToGlyphEncodingInfoMap::value_type(itGlyphs->mGlyphCode,GlyphEncodingInfo(*itEncoded,itGlyphs->mUnicodeValues)));
			}
		}

		outEncodedCharacters = candidatesList;
	}

	return result;	
}